

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<kj::String>::setCapacity(Vector<kj::String> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::String> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::String> newBuilder;
  size_t newSize_local;
  Vector<kj::String> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::String>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::String>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::String>>(&this->builder);
  ArrayBuilder<kj::String>::addAll<kj::ArrayBuilder<kj::String>>
            ((ArrayBuilder<kj::String> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::String>>((ArrayBuilder<kj::String> *)local_38);
  ArrayBuilder<kj::String>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }